

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O0

void __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>::
deallocate_array(memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>
                 *this,task_state_type *item)

{
  long lVar1;
  task_state_type *this_00;
  long lVar2;
  long in_RSI;
  
  if (in_RSI != 0) {
    this_00 = (task_state_type *)(in_RSI + -0x10);
    lVar1 = *(long *)(in_RSI + -8);
    for (lVar2 = in_RSI + lVar1 * 0x1a0; in_RSI != lVar2; lVar2 = lVar2 + -0x1a0) {
      thread_pool_implementation::task_state_type::~task_state_type(this_00);
    }
    operator_delete__(this_00,lVar1 * 0x1a0 + 0x10);
  }
  return;
}

Assistant:

void deallocate_array (
                T* item
            ) 
            { 
                delete [] item;
            }